

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  list<Task_*,_std::allocator<Task_*>_> *plVar1;
  _List_node_base *p_Var2;
  curl_off_t size;
  list<Task_*,_std::allocator<Task_*>_> *__range1;
  string *download_address;
  _List_node_base *p_Var3;
  argument args;
  char **in_stack_fffffffffffffea8;
  int local_150;
  string local_148;
  string local_128;
  download_status local_108;
  
  curl_global_init(3);
  local_108.taskMessageQueue.c.super__Deque_base<Task_*,_std::allocator<Task_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_108.taskMessageQueue.c.super__Deque_base<Task_*,_std::allocator<Task_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_108.taskMessageQueue.c.super__Deque_base<Task_*,_std::allocator<Task_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_108.taskMessageQueue.c.super__Deque_base<Task_*,_std::allocator<Task_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_108.taskMessageQueue.c.super__Deque_base<Task_*,_std::allocator<Task_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_108.taskMessageQueue.c.super__Deque_base<Task_*,_std::allocator<Task_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_108.taskMessageQueue.c.super__Deque_base<Task_*,_std::allocator<Task_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_108.taskMessageQueue.c.super__Deque_base<Task_*,_std::allocator<Task_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_108.taskMessageQueue.c.super__Deque_base<Task_*,_std::allocator<Task_*>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_108.taskMessageQueue.c.super__Deque_base<Task_*,_std::allocator<Task_*>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<Task_*,_std::allocator<Task_*>_>::_M_initialize_map
            ((_Deque_base<Task_*,_std::allocator<Task_*>_> *)&local_108,0);
  plVar1 = &local_108.globalTaskList;
  local_108.globalProxyList.super__List_base<proxy,_std::allocator<proxy>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&local_108.globalProxyList;
  local_108.globalTaskList.super__List_base<Task_*,_std::allocator<Task_*>_>._M_impl._M_node._M_size
       = 0;
  local_108.pending_proxy_servers.c.super__Deque_base<proxy,_std::allocator<proxy>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  local_108.pending_proxy_servers.c.super__Deque_base<proxy,_std::allocator<proxy>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_108.pending_proxy_servers.c.super__Deque_base<proxy,_std::allocator<proxy>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_108.pending_proxy_servers.c.super__Deque_base<proxy,_std::allocator<proxy>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_108.pending_proxy_servers.c.super__Deque_base<proxy,_std::allocator<proxy>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_108.pending_proxy_servers.c.super__Deque_base<proxy,_std::allocator<proxy>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_108.pending_proxy_servers.c.super__Deque_base<proxy,_std::allocator<proxy>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_108.pending_proxy_servers.c.super__Deque_base<proxy,_std::allocator<proxy>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_108.globalProxyList.super__List_base<proxy,_std::allocator<proxy>_>._M_impl._M_node._M_size
       = 0;
  local_108.pending_proxy_servers.c.super__Deque_base<proxy,_std::allocator<proxy>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_108.pending_proxy_servers.c.super__Deque_base<proxy,_std::allocator<proxy>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_108.globalTaskList.super__List_base<Task_*,_std::allocator<Task_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)plVar1;
  local_108.globalTaskList.super__List_base<Task_*,_std::allocator<Task_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)plVar1;
  local_108.globalProxyList.super__List_base<proxy,_std::allocator<proxy>_>._M_impl._M_node.
  super__List_node_base._M_prev =
       local_108.globalProxyList.super__List_base<proxy,_std::allocator<proxy>_>._M_impl._M_node.
       super__List_node_base._M_next;
  std::_Deque_base<proxy,_std::allocator<proxy>_>::_M_initialize_map
            ((_Deque_base<proxy,_std::allocator<proxy>_> *)&local_108.pending_proxy_servers,0);
  parser((argument *)&stack0xfffffffffffffea8,argc,argv);
  initialize_proxy_list(in_stack_fffffffffffffea8,local_150,&local_108);
  download_address = &local_148;
  size = get_file_size(download_address,
                       (string *)
                       (local_108.globalProxyList.super__List_base<proxy,_std::allocator<proxy>_>.
                        _M_impl._M_node.super__List_node_base._M_next + 1));
  create_file(local_128._M_dataplus._M_p,size);
  initialize_task_list(&local_128,download_address,size,&local_108);
  start_progress_thread((curl_off_t)in_stack_fffffffffffffea8,(download_status *)0x1027b8);
  message_loop(&local_128,download_address,size,&local_108);
  for (p_Var3 = local_108.globalTaskList.super__List_base<Task_*,_std::allocator<Task_*>_>._M_impl.
                _M_node.super__List_node_base._M_next; p_Var3 != (_List_node_base *)plVar1;
      p_Var3 = p_Var3->_M_next) {
    Task::wait((Task *)p_Var3[1]._M_next,download_address);
  }
  curl_global_cleanup();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  std::deque<proxy,_std::allocator<proxy>_>::~deque(&local_108.pending_proxy_servers.c);
  std::__cxx11::_List_base<proxy,_std::allocator<proxy>_>::_M_clear
            (&local_108.globalProxyList.super__List_base<proxy,_std::allocator<proxy>_>);
  p_Var3 = local_108.globalTaskList.super__List_base<Task_*,_std::allocator<Task_*>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  while (p_Var3 != (_List_node_base *)plVar1) {
    p_Var2 = (((_List_base<Task_*,_std::allocator<Task_*>_> *)&p_Var3->_M_next)->_M_impl)._M_node.
             super__List_node_base._M_next;
    operator_delete(p_Var3,0x18);
    p_Var3 = p_Var2;
  }
  std::_Deque_base<Task_*,_std::allocator<Task_*>_>::~_Deque_base
            ((_Deque_base<Task_*,_std::allocator<Task_*>_> *)&local_108);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    curl_global_init(CURL_GLOBAL_ALL);
    download_status Status{};// Status是全局的，包含当前下载的所有状态
    argument args = parser(argc, argv);
    initialize_proxy_list(args.proxy_list, args.proxy_count, &Status);
    curl_off_t file_length = get_file_size(args.download_address, Status.globalProxyList.front().address);
    create_file(args.file_name.c_str(), file_length);
    initialize_task_list(args.file_name, args.download_address, file_length, &Status);
    start_progress_thread(file_length, &Status);
    message_loop(args.file_name, args.download_address, file_length, &Status);
    for (Task *&task:Status.globalTaskList) {
        (*task).wait();
    }
    curl_global_cleanup();
}